

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

void __thiscall
MyACESPictureDescriptor::FillDescriptor(MyACESPictureDescriptor *this,MXFReader *Reader)

{
  MDD_t MVar1;
  char *pcVar2;
  RGBAEssenceDescriptor *pRVar3;
  long *plVar4;
  undefined8 uVar5;
  ILogSink *pIVar6;
  _List_node_base *p_Var7;
  ACESPictureSubDescriptor *p;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  char buf [64];
  Result_t local_168 [104];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  MVar1 = ASDCP::DefaultCompositeDict();
  pcVar2 = (char *)ASDCP::Dictionary::Type(MVar1);
  buf[8] = '\x01';
  buf._9_8_ = *(undefined8 *)pcVar2;
  buf._17_8_ = *(undefined8 *)(pcVar2 + 8);
  buf._0_8_ = &PTR__IArchive_00115ae8;
  pRVar3 = get_descriptor_by_type<AS_02::ACES::MXFReader,ASDCP::MXF::RGBAEssenceDescriptor>
                     (Reader,(UL *)buf);
  this->m_RGBADescriptor = pRVar3;
  if (pRVar3 == (RGBAEssenceDescriptor *)0x0) {
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar6,"Picture descriptor not found.\n");
  }
  else {
    (this->super_PictureDescriptor).SampleRate = *(Rational *)(pRVar3 + 0xf0);
    if (pRVar3[0x100] == (RGBAEssenceDescriptor)0x1) {
      (this->super_PictureDescriptor).ContainerDuration = *(ui32_t *)(pRVar3 + 0xf8);
    }
  }
  object_list.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&object_list;
  object_list.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size = 0;
  object_list.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       object_list.
       super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  plVar4 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar1 = ASDCP::DefaultCompositeDict();
  uVar5 = ASDCP::Dictionary::Type(MVar1);
  (**(code **)(*plVar4 + 0xb0))(local_98,plVar4,uVar5,(_List_node_base *)&object_list);
  Kumu::Result_t::~Result_t(local_98);
  p_Var7 = (_List_node_base *)&object_list;
LAB_0010e7cd:
  do {
    p_Var7 = (((_List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var7 == (_List_node_base *)&object_list) break;
    if (p_Var7[1]._M_next == (_List_node_base *)0x0) {
      p = (ACESPictureSubDescriptor *)0x0;
    }
    else {
      p = (ACESPictureSubDescriptor *)
          __dynamic_cast(p_Var7[1]._M_next,&ASDCP::MXF::InterchangeObject::typeinfo,
                         &ASDCP::MXF::ACESPictureSubDescriptor::typeinfo,0);
      if (p != (ACESPictureSubDescriptor *)0x0) {
        std::__cxx11::
        list<ASDCP::MXF::ACESPictureSubDescriptor_*,_std::allocator<ASDCP::MXF::ACESPictureSubDescriptor_*>_>
        ::push_back(&this->m_ACESPictureSubDescriptorList,&p);
        goto LAB_0010e7cd;
      }
    }
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar2 = Kumu::UUID::EncodeHex((UUID *)((long)p_Var7[1]._M_next + 0x58),buf,0x40);
    Kumu::ILogSink::Error(pIVar6,"ACESPictureSubDescriptor type error.\n",pcVar2);
  } while( true );
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::clear
            (&object_list);
  plVar4 = (long *)(**(code **)(*(long *)Reader + 0x10))();
  MVar1 = ASDCP::DefaultCompositeDict();
  uVar5 = ASDCP::Dictionary::Type(MVar1);
  (**(code **)(*plVar4 + 0xb0))(local_100,plVar4,uVar5,(_List_node_base *)&object_list);
  Kumu::Result_t::~Result_t(local_100);
  p_Var7 = (_List_node_base *)&object_list;
LAB_0010e8ad:
  do {
    p_Var7 = (((_List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var7 == (_List_node_base *)&object_list) {
      std::__cxx11::
      list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::clear
                (&object_list);
      plVar4 = (long *)(**(code **)(*(long *)Reader + 0x10))();
      MVar1 = ASDCP::DefaultCompositeDict();
      uVar5 = ASDCP::Dictionary::Type(MVar1);
      (**(code **)(*plVar4 + 0xb0))(local_168,plVar4,uVar5,(_List_node_base *)&object_list);
      Kumu::Result_t::~Result_t(local_168);
      if (object_list.
          super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
          ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&object_list) {
        pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar6,"MXF Metadata contains no Track Sets.\n");
      }
      (this->super_PictureDescriptor).EditRate =
           (Rational)
           object_list.
           super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
           ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[0x10]._M_prev;
      std::__cxx11::
      _List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
      ::_M_clear(&object_list.
                  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                );
      return;
    }
    if (p_Var7[1]._M_next == (_List_node_base *)0x0) {
      p = (ACESPictureSubDescriptor *)0x0;
    }
    else {
      p = (ACESPictureSubDescriptor *)
          __dynamic_cast(p_Var7[1]._M_next,&ASDCP::MXF::InterchangeObject::typeinfo,
                         &ASDCP::MXF::TargetFrameSubDescriptor::typeinfo,0);
      if (p != (ACESPictureSubDescriptor *)0x0) {
        std::__cxx11::
        list<ASDCP::MXF::TargetFrameSubDescriptor_*,_std::allocator<ASDCP::MXF::TargetFrameSubDescriptor_*>_>
        ::push_back(&this->m_TargetFrameSubDescriptorList,(value_type *)&p);
        goto LAB_0010e8ad;
      }
    }
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar2 = Kumu::UUID::EncodeHex((UUID *)((long)p_Var7[1]._M_next + 0x58),buf,0x40);
    Kumu::ILogSink::Error(pIVar6,"TargetFrameSubDescriptor type error.\n",pcVar2);
  } while( true );
}

Assistant:

void FillDescriptor(AS_02::ACES::MXFReader& Reader)
  {
    m_RGBADescriptor = get_descriptor_by_type<AS_02::ACES::MXFReader, RGBAEssenceDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor));

    if ( m_RGBADescriptor != 0 )
      {
    	SampleRate = m_RGBADescriptor->SampleRate;
        if ( ! m_RGBADescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_RGBADescriptor->ContainerDuration;
          }
      }
    else
      {
	DefaultLogSink().Error("Picture descriptor not found.\n");
      }

    std::list<InterchangeObject*> object_list;
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_ACESPictureSubDescriptor), object_list);

    std::list<InterchangeObject*>::iterator i = object_list.begin();
    for ( ; i != object_list.end(); ++i )
      {
    	ACESPictureSubDescriptor *p = dynamic_cast<ACESPictureSubDescriptor*>(*i);

	if ( p )
	  {
		m_ACESPictureSubDescriptorList.push_back(p);
	  }
	else
	  {
	    char buf[64];
	    DefaultLogSink().Error("ACESPictureSubDescriptor type error.\n", (**i).InstanceUID.EncodeHex(buf, 64));
	  }
      }

    object_list.clear();

    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_TargetFrameSubDescriptor), object_list);

    i = object_list.begin();
    for ( ; i != object_list.end(); ++i )
      {
    	TargetFrameSubDescriptor *p = dynamic_cast<TargetFrameSubDescriptor*>(*i);

	if ( p )
	  {
		m_TargetFrameSubDescriptorList.push_back(p);
	  }
	else
	  {
	    char buf[64];
	    DefaultLogSink().Error("TargetFrameSubDescriptor type error.\n", (**i).InstanceUID.EncodeHex(buf, 64));
	  }
      }

    object_list.clear();

    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_Track), object_list);

    if ( object_list.empty() )
      {
	DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
      }

    EditRate = ((Track*)object_list.front())->EditRate;
  }